

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall SuiteMessageTests::TestaddRemoveGroup::~TestaddRemoveGroup(TestaddRemoveGroup *this)

{
  TestaddRemoveGroup *this_local;
  
  ~TestaddRemoveGroup(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(addRemoveGroup)
{
  FIX::Message object;
  object.setField( ListID( "1" ) );
  object.setField( BidType( 0 ) );
  object.setField( TotNoOrders( 3 ) );

  FIX42::NewOrderList::NoOrders group;
  group.set( ClOrdID( "A" ) );
  group.set( ListSeqNo( 1 ) );
  group.set( Symbol( "DELL" ) );
  group.set( Side( '1' ) );
  object.addGroup( group );

  group.set( ClOrdID( "B" ) );
  group.set( ListSeqNo( 2 ) );
  group.set( Symbol( "LNUX" ) );
  group.set( Side( '2' ) );
  object.addGroup( group );

  group.set( ClOrdID( "C" ) );
  group.set( ListSeqNo( 3 ) );
  group.set( Symbol( "RHAT" ) );
  group.set( Side( '3' ) );
  object.addGroup( group );

  NoOrders noOrders;

  CHECK( object.hasGroup(1, group) );
  CHECK( object.hasGroup(2, group) );
  CHECK( object.hasGroup(3, group) );
  CHECK_EQUAL( 3lu, object.groupCount(FIX::FIELD::NoOrders) );
  object.getField( noOrders );
  CHECK_EQUAL( 3, noOrders );

  object.removeGroup( 2, group );
  CHECK( object.hasGroup(1, group) );
  CHECK( object.hasGroup(2, group) );
  CHECK( !object.hasGroup(3, group) );
  CHECK_EQUAL( 2lu, object.groupCount(FIX::FIELD::NoOrders) );
  object.getField( noOrders );
  CHECK_EQUAL( 2, noOrders );

  object.removeGroup( group );
  CHECK( !object.hasGroup(1, group) );
  CHECK( !object.hasGroup(2, group) );
  CHECK( !object.hasGroup(3, group) );
  CHECK_EQUAL( 0lu, object.groupCount(FIX::FIELD::NoOrders) );
  CHECK( !object.isSetField( noOrders ) );
}